

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_file_rename.c
# Opt level: O0

int zip_file_rename(zip_t *za,zip_uint64_t idx,char *name,zip_flags_t flags)

{
  size_t sVar1;
  char *__s;
  bool local_41;
  int new_is_dir;
  int old_is_dir;
  char *old_name;
  zip_flags_t flags_local;
  char *name_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  if (idx < za->nentry) {
    if (name != (char *)0x0) {
      sVar1 = strlen(name);
      if (0xffff < sVar1) goto LAB_0010e88d;
    }
    if ((za->ch_flags & 2) == 0) {
      __s = zip_get_name(za,idx,0);
      if (__s == (char *)0x0) {
        za_local._4_4_ = -1;
      }
      else {
        local_41 = false;
        if (name != (char *)0x0) {
          sVar1 = strlen(name);
          local_41 = name[sVar1 - 1] == '/';
        }
        sVar1 = strlen(__s);
        if (local_41 == (__s[sVar1 - 1] == '/')) {
          za_local._4_4_ = _zip_set_name(za,idx,name,flags);
        }
        else {
          zip_error_set(&za->error,0x12,0);
          za_local._4_4_ = -1;
        }
      }
    }
    else {
      zip_error_set(&za->error,0x19,0);
      za_local._4_4_ = -1;
    }
  }
  else {
LAB_0010e88d:
    zip_error_set(&za->error,0x12,0);
    za_local._4_4_ = -1;
  }
  return za_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_file_rename(zip_t *za, zip_uint64_t idx, const char *name, zip_flags_t flags) {
    const char *old_name;
    int old_is_dir, new_is_dir;

    if (idx >= za->nentry || (name != NULL && strlen(name) > ZIP_UINT16_MAX)) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if (ZIP_IS_RDONLY(za)) {
        zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
        return -1;
    }

    if ((old_name = zip_get_name(za, idx, 0)) == NULL)
        return -1;

    new_is_dir = (name != NULL && name[strlen(name) - 1] == '/');
    old_is_dir = (old_name[strlen(old_name) - 1] == '/');

    if (new_is_dir != old_is_dir) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    return _zip_set_name(za, idx, name, flags);
}